

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O1

QSize __thiscall
QStyledItemDelegate::sizeHint
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  QWidget *this_00;
  bool bVar2;
  QStyle *pQVar3;
  QMetaType QVar4;
  QSize QVar5;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  QMetaType local_120;
  undefined1 local_118 [112];
  QSize local_a8 [6];
  QSize local_78;
  QArrayData *local_70;
  QSize local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = (undefined1 *)0x0;
    local_48._16_8_ = (undefined1 *)0x0;
    puStack_30 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x90))(&local_48,pQVar1,index,0xd);
  }
  if (puStack_30 < (undefined1 *)0x4) {
    memset((QStyleOptionViewItem *)local_118,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_118,option);
    (**(code **)(*(long *)this + 0xb8))(this,(QStyleOptionViewItem *)local_118,index);
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar3 = QApplication::style();
    }
    else {
      pQVar3 = QWidget::style(this_00);
    }
    local_120.d_ptr = (QMetaTypeInterface *)0xffffffffffffffff;
    QVar5 = (QSize)(**(code **)(*(long *)pQVar3 + 0xe8))
                             (pQVar3,0x16,(QSize *)local_118,&local_120,this_00);
    QBrush::~QBrush((QBrush *)&local_50);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    QIcon::~QIcon((QIcon *)&local_78);
    QLocale::~QLocale((QLocale *)local_a8);
    QFont::~QFont((QFont *)(local_118 + 0x58));
    QStyleOption::~QStyleOption((QStyleOption *)local_118);
  }
  else {
    local_120.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType;
    local_118._0_8_ = (ulong)puStack_30 & 0xfffffffffffffffc;
    bVar2 = comparesEqual((QMetaType *)local_118,&local_120);
    if (bVar2) {
      if (((ulong)puStack_30 & 1) == 0) {
        paVar6 = &local_48;
      }
      else {
        paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_48.shared + *(int *)(local_48.shared + 4));
      }
      local_118._0_8_ = paVar6->shared;
      QVar5 = (QSize)local_118._0_8_;
    }
    else {
      local_118._0_4_ = -1;
      local_118._4_4_ = -1;
      paVar6 = &local_48;
      QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_30 & 1) != 0) {
        paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_48.shared + *(int *)(local_48.shared + 4));
      }
      QMetaType::convert(QVar4,paVar6,local_120,(QSize *)local_118);
      QVar5 = (QSize)local_118._0_8_;
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return QVar5;
}

Assistant:

QSize QStyledItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);
    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    return style->sizeFromContents(QStyle::CT_ItemViewItem, &opt, QSize(), widget);
}